

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  uint uVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  timeval *__timeout;
  long lVar11;
  char cVar12;
  uint uVar13;
  long lVar14;
  __time_t _Var15;
  long lVar16;
  double dVar17;
  double dVar18;
  kwsysProcessTime kVar19;
  long local_190;
  double *local_188;
  kwsysProcessTime local_180;
  timeval local_140;
  sigset_t local_130;
  sigset_t mask;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  if (cp->State != 3) {
    return 0;
  }
  if (cp->Killed != 0) {
    return 0;
  }
  if (cp->TimeoutExpired != 0) {
    return 0;
  }
  if (userTimeout == (double *)0x0) {
    local_180 = (kwsysProcessTime)ZEXT816(0);
  }
  else {
    local_180 = kwsysProcessTimeGetCurrent();
  }
  dVar18 = cp->Timeout;
  lVar16 = (cp->TimeoutTime).tv_sec;
  if (lVar16 < 0 && 0.0 < dVar18) {
    lVar9 = (long)((dVar18 - (double)(long)dVar18) * 1000000.0);
    lVar14 = (cp->StartTime).tv_usec;
    lVar16 = lVar14 + lVar9;
    lVar14 = lVar14 + -1000000 + lVar9;
    if (lVar16 < 1000000) {
      lVar14 = lVar16;
    }
    lVar16 = (ulong)(999999 < lVar16) + (long)dVar18 + (cp->StartTime).tv_sec;
    (cp->TimeoutTime).tv_sec = lVar16;
    (cp->TimeoutTime).tv_usec = lVar14;
  }
  lVar14 = (cp->TimeoutTime).tv_usec;
  if (userTimeout == (double *)0x0) {
LAB_0047ee87:
    local_188 = (double *)0x0;
    bVar2 = false;
    lVar9 = lVar16;
    local_190 = lVar14;
  }
  else {
    kVar19 = kwsysProcessTimeGetCurrent();
    lVar10 = (long)*userTimeout;
    lVar11 = (long)((*userTimeout - (double)lVar10) * 1000000.0);
    lVar9 = kVar19.tv_usec + lVar11;
    local_190 = kVar19.tv_usec + -1000000 + lVar11;
    if (lVar9 < 1000000) {
      local_190 = lVar9;
    }
    lVar9 = (ulong)(999999 < lVar9) + kVar19.tv_sec + lVar10;
    if (-1 < lVar16) {
      if ((lVar16 <= lVar9) && (lVar9 != lVar16 || lVar14 <= local_190)) goto LAB_0047ee87;
    }
    bVar2 = true;
    local_188 = userTimeout;
  }
  __readfds = &cp->PipeSet;
  __timeout = &local_140;
  if (lVar9 < 0) {
    __timeout = (timeval *)0x0;
  }
LAB_0047ef0c:
  do {
    if (cp->PipesLeft < 1) {
      iVar3 = 0;
      cVar12 = '\x01';
      goto LAB_0047f255;
    }
    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
      uVar13 = cp->PipeReadEnds[lVar16];
      if (-1 < (int)uVar13) {
        if (((ulong)__readfds->fds_bits[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
          __readfds->fds_bits[uVar13 >> 6] =
               __readfds->fds_bits[uVar13 >> 6] & ~(1L << ((byte)uVar13 & 0x3f));
          do {
            sVar6 = read(cp->PipeReadEnds[lVar16],cp->PipeBuffer,0x400);
            if (-1 < sVar6) {
              if (sVar6 == 0) goto LAB_0047f08e;
              if (lVar16 == 2) {
                sigemptyset((sigset_t *)&mask);
                sigaddset((sigset_t *)&mask,2);
                sigaddset((sigset_t *)&mask,0xf);
                iVar3 = sigprocmask(0,(sigset_t *)&mask,&local_130);
                if (-1 < iVar3) {
                  for (lVar14 = 0; lVar14 < cp->NumberOfCommands; lVar14 = lVar14 + 1) {
                    if (cp->ForkPIDs[lVar14] != 0) {
                      do {
                        _Var4 = waitpid(cp->ForkPIDs[lVar14],cp->CommandExitCodes + lVar14,1);
                        if (-1 < _Var4) {
                          if (_Var4 != 0) {
                            cp->ForkPIDs[lVar14] = 0;
                            piVar7 = &cp->CommandsLeft;
                            *piVar7 = *piVar7 + -1;
                            if (*piVar7 == 0) {
                              kwsysProcessCleanupDescriptor(&cp->SignalPipe);
                            }
                          }
                          goto LAB_0047f086;
                        }
                        piVar7 = __errno_location();
                      } while (*piVar7 == 4);
                      if (cp->State != 1) {
                        pcVar8 = strerror(*piVar7);
                        strncpy(cp->ErrorMessage,pcVar8,0x400);
                        cp->State = 1;
                      }
                    }
LAB_0047f086:
                  }
                  sigprocmask(2,&local_130,(sigset_t *)0x0);
                }
                goto LAB_0047f0a1;
              }
              if (length == (int *)0x0 || data == (char **)0x0) goto LAB_0047f0a1;
              *data = cp->PipeBuffer;
              *length = (int)sVar6;
              cVar12 = '\x01';
              if ((int)lVar16 == 1) {
                iVar3 = 3;
              }
              else {
                cVar12 = '\x01';
                if ((int)lVar16 == 0) {
                  iVar3 = 2;
                }
                else {
                  iVar3 = 0;
                }
              }
              goto LAB_0047f255;
            }
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
          if (*piVar7 != 0xb) {
LAB_0047f08e:
            kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar16);
            cp->PipesLeft = cp->PipesLeft + -1;
          }
        }
      }
LAB_0047f0a1:
    }
    for (lVar16 = 0x91; lVar16 != 0xa1; lVar16 = lVar16 + 1) {
      (cp->PipeReadEnds + lVar16 * 2 + -3)[0] = 0;
      (cp->PipeReadEnds + lVar16 * 2 + -3)[1] = 0;
    }
    _Var15 = local_140.tv_sec;
    lVar16 = local_140.tv_usec;
    if (-1 < lVar9) {
      kVar19 = kwsysProcessTimeGetCurrent();
      lVar14 = local_190 - kVar19.tv_usec;
      _Var15 = (lVar14 >> 0x3f) + (lVar9 - kVar19.tv_sec);
      if ((local_188 == (double *)0x0) || (-1 < _Var15)) {
        lVar16 = lVar14 + 1000000;
        if (-1 < lVar14) {
          lVar16 = lVar14;
        }
        if (-1 < _Var15) goto LAB_0047f157;
LAB_0047f23e:
        iVar3 = 0;
        cVar12 = '\0';
      }
      else {
        _Var15 = 0;
        if (*local_188 <= 0.0) {
          lVar16 = 0;
          goto LAB_0047f157;
        }
LAB_0047f23a:
        cVar12 = (char)_Var15;
        iVar3 = 0;
      }
LAB_0047f255:
      if (userTimeout != (double *)0x0) {
        kVar19 = kwsysProcessTimeGetCurrent();
        local_180.tv_usec = kVar19.tv_usec - local_180.tv_usec;
        lVar16 = local_180.tv_usec + 1000000;
        if (-1 < local_180.tv_usec) {
          lVar16 = local_180.tv_usec;
        }
        dVar17 = *userTimeout -
                 ((double)lVar16 * 1e-06 +
                 (double)((local_180.tv_usec >> 0x3f) + (kVar19.tv_sec - local_180.tv_sec)));
        dVar18 = 0.0;
        if (0.0 <= dVar17) {
          dVar18 = dVar17;
        }
        *userTimeout = dVar18;
      }
      iVar5 = 0xff;
      if (iVar3 != 0 || cVar12 != '\0') {
        iVar5 = iVar3;
      }
      if (!bVar2 && (iVar3 == 0 && cVar12 == '\0')) {
        cmsysProcess_Kill(cp);
        cp->Killed = 0;
        cp->TimeoutExpired = 1;
        iVar5 = 0;
      }
      return iVar5;
    }
LAB_0047f157:
    local_140.tv_usec = lVar16;
    local_140.tv_sec = _Var15;
    uVar13 = 0xffffffff;
    for (lVar16 = 3; lVar16 != 6; lVar16 = lVar16 + 1) {
      uVar1 = cp->PipeReadEnds[lVar16 + -3];
      if ((-1 < (int)uVar1) &&
         (__readfds->fds_bits[uVar1 >> 6] =
               __readfds->fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f),
         (int)uVar13 < (int)uVar1)) {
        uVar13 = uVar1;
      }
    }
    if ((int)uVar13 < 0) {
      _Var15 = 1;
      goto LAB_0047f23a;
    }
    do {
      iVar3 = select(uVar13 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,__timeout);
      if (-1 < iVar3) {
        if (iVar3 != 0) goto LAB_0047ef0c;
        goto LAB_0047f23e;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    pcVar8 = strerror(*piVar7);
    strncpy(cp->ErrorMessage,pcVar8,0x400);
    cmsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->SelectError = 1;
  } while( true );
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = { 0, 0 };
  kwsysProcessWaitData wd = { 0, kwsysProcess_Pipe_None, 0, 0, { 0, 0 } };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if (!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
      cp->TimeoutExpired) {
    return kwsysProcess_Pipe_None;
  }

  /* Record the time at which user timeout period starts.  */
  if (userTimeout) {
    userStartTime = kwsysProcessTimeGetCurrent();
  }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout, &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while (cp->PipesLeft > 0 &&
         !kwsysProcessWaitForPipe(cp, data, length, &wd)) {
  }

  /* Update the user timeout.  */
  if (userTimeout) {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference =
      kwsysProcessTimeSubtract(userEndTime, userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if (*userTimeout < 0) {
      *userTimeout = 0;
    }
  }

  /* Check what happened.  */
  if (wd.PipeId) {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
  }
  if (wd.Expired) {
    /* A timeout has expired.  */
    if (wd.User) {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
    }

    /* The process timeout has expired.  Kill the children now.  */
    kwsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->TimeoutExpired = 1;
    return kwsysProcess_Pipe_None;
  }
  /* No pipes are left open.  */
  return kwsysProcess_Pipe_None;
}